

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O1

void __thiscall hwnet::util::Timer::operator()(Timer *this)

{
  undefined8 uVar1;
  __shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2> local_20 [8];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  std::__shared_ptr<hwnet::util::Timer,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::util::Timer,void>
            (local_20,(__weak_ptr<hwnet::util::Timer,_(__gnu_cxx::_Lock_policy)2> *)this);
  if ((this->mCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->mCallback)._M_invoker)
              ((_Any_data *)&this->mCallback,(shared_ptr<hwnet::util::Timer> *)local_20);
    if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
    }
    return;
  }
  uVar1 = std::__throw_bad_function_call();
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  _Unwind_Resume(uVar1);
}

Assistant:

void Timer::operator() ()
{	
    mCallback(shared_from_this());   
}